

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

bool __thiscall HEkk::bailout(HEkk *this)

{
  double *pdVar1;
  HighsCallback *pHVar2;
  bool bVar3;
  HighsOptions *pHVar4;
  HighsModelStatus HVar5;
  size_t in_RCX;
  void *in_RDX;
  double extraout_XMM0_Qa;
  string local_48;
  
  if (this->solve_bailout_ != false) goto LAB_003412e0;
  pHVar4 = this->options_;
  if ((pHVar4->super_HighsOptionsStruct).time_limit == INFINITY) {
LAB_00341226:
    HVar5 = kIterationLimit;
    if (this->iteration_count_ < (pHVar4->super_HighsOptionsStruct).simplex_iteration_limit) {
      pHVar2 = this->callback_;
      if (((pHVar2->user_callback).super__Function_base._M_manager == (_Manager_type)0x0) ||
         ((*(pHVar2->active).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 2) == 0))
      goto LAB_003412e0;
      HighsCallback::clearHighsCallbackDataOut(pHVar2);
      pHVar2 = this->callback_;
      (pHVar2->data_out).simplex_iteration_count = this->iteration_count_;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Simplex interrupt","");
      bVar3 = HighsCallback::callbackAction(pHVar2,1,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      if (!bVar3) goto LAB_003412e0;
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,"User interrupt\n");
      HVar5 = kInterrupt;
    }
  }
  else {
    HighsTimer::read(this->timer_,0,in_RDX,in_RCX);
    pHVar4 = this->options_;
    HVar5 = kTimeLimit;
    pdVar1 = &(pHVar4->super_HighsOptionsStruct).time_limit;
    if (extraout_XMM0_Qa < *pdVar1 || extraout_XMM0_Qa == *pdVar1) goto LAB_00341226;
  }
  this->solve_bailout_ = true;
  this->model_status_ = HVar5;
LAB_003412e0:
  return this->solve_bailout_;
}

Assistant:

bool HEkk::bailout() {
  if (solve_bailout_) {
    // Bailout has already been decided: check that it's for one of these
    // reasons
    assert(model_status_ == HighsModelStatus::kTimeLimit ||
           model_status_ == HighsModelStatus::kIterationLimit ||
           model_status_ == HighsModelStatus::kObjectiveBound ||
           model_status_ == HighsModelStatus::kObjectiveTarget);
  } else if (options_->time_limit < kHighsInf &&
             timer_->read() > options_->time_limit) {
    solve_bailout_ = true;
    model_status_ = HighsModelStatus::kTimeLimit;
  } else if (iteration_count_ >= options_->simplex_iteration_limit) {
    solve_bailout_ = true;
    model_status_ = HighsModelStatus::kIterationLimit;
  } else if (callback_->user_callback &&
             callback_->active[kCallbackSimplexInterrupt]) {
    callback_->clearHighsCallbackDataOut();
    callback_->data_out.simplex_iteration_count = iteration_count_;
    if (callback_->callbackAction(kCallbackSimplexInterrupt,
                                  "Simplex interrupt")) {
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  "User interrupt\n");
      solve_bailout_ = true;
      model_status_ = HighsModelStatus::kInterrupt;
    }
  }
  return solve_bailout_;
}